

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

Block * __thiscall
wasm::I64ToI32Lowering::lowerUComp
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  BinaryOp BVar1;
  BinaryOp BVar2;
  Index IVar3;
  Builder *pBVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Binary *this_00;
  Binary *pBVar7;
  Binary *this_01;
  Binary *this_02;
  Block *pBVar8;
  uint uVar9;
  
  uVar9 = op - LtUInt64;
  if ((uVar9 < 7) && ((0x55U >> (uVar9 & 0x1f) & 1) != 0)) {
    if (leftHigh->moved != true) {
      BVar1 = *(BinaryOp *)(&DAT_00de23fc + (ulong)uVar9 * 4);
      BVar2 = *(BinaryOp *)(&DAT_00de2418 + (ulong)uVar9 * 4);
      pBVar4 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar3 = leftHigh->idx;
      pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
      pEVar5->_id = LocalGetId;
      *(Index *)(pEVar5 + 1) = IVar3;
      (pEVar5->type).id = 2;
      if (rightHigh->moved != true) {
        IVar3 = rightHigh->idx;
        pEVar6 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                             allocator,0x18,8);
        pEVar6->_id = LocalGetId;
        *(Index *)(pEVar6 + 1) = IVar3;
        (pEVar6->type).id = 2;
        this_00 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        this_00->op = BVar2;
        this_00->left = pEVar5;
        this_00->right = pEVar6;
        Binary::finalize(this_00);
        if (leftHigh->moved != true) {
          pBVar4 = (this->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          IVar3 = leftHigh->idx;
          pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
          pEVar5->_id = LocalGetId;
          *(Index *)(pEVar5 + 1) = IVar3;
          (pEVar5->type).id = 2;
          if (rightHigh->moved != true) {
            IVar3 = rightHigh->idx;
            pEVar6 = (Expression *)
                     MixedArena::allocSpace
                               (&((this->builder)._M_t.
                                  super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                  .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm
                                 ->allocator,0x18,8);
            pEVar6->_id = LocalGetId;
            *(Index *)(pEVar6 + 1) = IVar3;
            (pEVar6->type).id = 2;
            pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
            (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                 BinaryId;
            (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
                 0;
            pBVar7->op = EqInt32;
            pBVar7->left = pEVar5;
            pBVar7->right = pEVar6;
            Binary::finalize(pBVar7);
            if (leftLow->moved != true) {
              pBVar4 = (this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
              IVar3 = leftLow->idx;
              pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
              pEVar5->_id = LocalGetId;
              *(Index *)(pEVar5 + 1) = IVar3;
              (pEVar5->type).id = 2;
              if (rightLow->moved != true) {
                IVar3 = rightLow->idx;
                pEVar6 = (Expression *)
                         MixedArena::allocSpace
                                   (&((this->builder)._M_t.
                                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                      .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->
                                     wasm->allocator,0x18,8);
                pEVar6->_id = LocalGetId;
                *(Index *)(pEVar6 + 1) = IVar3;
                (pEVar6->type).id = 2;
                this_01 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
                (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                     BinaryId;
                (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.
                id = 0;
                this_01->op = BVar1;
                this_01->left = pEVar5;
                this_01->right = pEVar6;
                Binary::finalize(this_01);
                pBVar4 = (this->builder)._M_t.
                         super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                         .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
                this_02 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
                (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                     BinaryId;
                (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.
                id = 0;
                this_02->op = AndInt32;
                this_02->left = (Expression *)pBVar7;
                this_02->right = (Expression *)this_01;
                Binary::finalize(this_02);
                pBVar7 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
                (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                     BinaryId;
                (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.
                id = 0;
                pBVar7->op = OrInt32;
                pBVar7->left = (Expression *)this_00;
                pBVar7->right = (Expression *)this_02;
                Binary::finalize(pBVar7);
                pBVar8 = Builder::blockify(pBVar4,(Expression *)result,(Expression *)pBVar7);
                return pBVar8;
              }
            }
          }
        }
      }
    }
    __assert_fail("!moved",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
  }
  abort();
}

Assistant:

Block* lowerUComp(BinaryOp op,
                    Block* result,
                    TempVar&& leftLow,
                    TempVar&& leftHigh,
                    TempVar&& rightLow,
                    TempVar&& rightHigh) {
    BinaryOp highOp, lowOp;
    switch (op) {
      case LtUInt64:
        highOp = LtUInt32;
        lowOp = LtUInt32;
        break;
      case LeUInt64:
        highOp = LtUInt32;
        lowOp = LeUInt32;
        break;
      case GtUInt64:
        highOp = GtUInt32;
        lowOp = GtUInt32;
        break;
      case GeUInt64:
        highOp = GtUInt32;
        lowOp = GeUInt32;
        break;
      default:
        abort();
    }
    Binary* compHigh =
      builder->makeBinary(highOp,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32));
    Binary* eqHigh =
      builder->makeBinary(EqInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32));
    Binary* compLow =
      builder->makeBinary(lowOp,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32));
    return builder->blockify(
      result,
      builder->makeBinary(
        OrInt32, compHigh, builder->makeBinary(AndInt32, eqHigh, compLow)));
  }